

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.c
# Opt level: O0

char * getquoted(void)

{
  char cVar1;
  char *pcVar2;
  char *bp;
  char c;
  char *local_18;
  char *local_8;
  
  skip();
  if (*s == '\"') {
    local_18 = getquoted::buffer;
    s = s + 1;
    do {
      cVar1 = *s;
      if (cVar1 == '\0') break;
      s = s + 1;
      if (cVar1 == '\n') {
        line = line + 1;
        break;
      }
      if (cVar1 == '\"') break;
      pcVar2 = local_18 + 1;
      *local_18 = cVar1;
      local_18 = pcVar2;
    } while (pcVar2 <= getquoted::buffer + 0xfe);
    *local_18 = '\0';
    local_8 = getquoted::buffer;
  }
  else {
    local_8 = (char *)0x0;
  }
  return local_8;
}

Assistant:

char *getquoted(void)
/* return characters between "quotes" */
{
  skip();
  if (*s == '\"') {
    static char buffer[MAXLEN];
    char c,*bp=buffer;

    s++;

    while (c = *s) {
      s++;

      if (c == '\n') {
        line++;
        break;  /* @@@ newline breaks string? */
      }
      else if (c == '\"')
        break;

      *bp++ = c;
      if (bp >= &buffer[MAXLEN-1])
        break;  /* buffer overflow */
    }
    *bp = '\0';
    return buffer;
  }

  return NULL;
}